

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O2

int scroll_indicator_pos_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  long lVar5;
  long val_1;
  long val_2;
  float fVar6;
  float val_1_00;
  float val_2_00;
  Am_Object scroll_bar;
  Am_Value value_2;
  Am_Value value_1;
  Am_Value value_v;
  
  Am_Object::Get_Owner(&scroll_bar,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&scroll_bar);
  if (bVar1) {
    pAVar4 = Am_Object::Get(&scroll_bar,0x1b2,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(&scroll_bar,0x1b3,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    value_v.type = 0;
    value_v.value.wrapper_value = (Am_Wrapper *)0x0;
    value_1.type = 0;
    value_1.value.wrapper_value = (Am_Wrapper *)0x0;
    value_2.type = 0;
    value_2.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar4 = Am_Object::Get(&scroll_bar,0x169,0);
    Am_Value::operator=(&value_v,pAVar4);
    pAVar4 = Am_Object::Get(&scroll_bar,0x181,0);
    Am_Value::operator=(&value_1,pAVar4);
    pAVar4 = Am_Object::Get(&scroll_bar,0x182,0);
    Am_Value::operator=(&value_2,pAVar4);
    if (((value_v.type == 2) && (value_1.type == 2)) && (value_2.type == 2)) {
      lVar5 = Am_Value::operator_cast_to_long(&value_v);
      val_1 = Am_Value::operator_cast_to_long(&value_1);
      val_2 = Am_Value::operator_cast_to_long(&value_2);
      lVar5 = Am_Clip_And_Map(lVar5,val_1,val_2,(long)iVar2,(long)iVar3);
      iVar2 = (int)lVar5;
    }
    else {
      fVar6 = Am_Value::operator_cast_to_float(&value_v);
      val_1_00 = Am_Value::operator_cast_to_float(&value_1);
      val_2_00 = Am_Value::operator_cast_to_float(&value_2);
      fVar6 = Am_Clip_And_Map(fVar6,val_1_00,val_2_00,(float)iVar2,(float)iVar3);
      iVar2 = (int)fVar6;
    }
    Am_Value::~Am_Value(&value_2);
    Am_Value::~Am_Value(&value_1);
    Am_Value::~Am_Value(&value_v);
  }
  else {
    iVar2 = 10;
  }
  Am_Object::~Am_Object(&scroll_bar);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, scroll_indicator_pos)
{
  int return_val;
  Am_Object scroll_bar = self.Get_Owner();
  if (!scroll_bar.Valid())
    return 10;
  int minpos = scroll_bar.Get(Am_SCROLL_AREA_MIN);
  int maxpos = scroll_bar.Get(Am_SCROLL_AREA_MAX);
  Am_Value value_v;
  Am_Value value_1;
  Am_Value value_2;
  value_v = scroll_bar.Get(Am_VALUE);
  value_1 = scroll_bar.Get(Am_VALUE_1);
  value_2 = scroll_bar.Get(Am_VALUE_2);

  if (value_v.type == Am_INT && value_1.type == Am_INT &&
      value_2.type == Am_INT)
    return_val =
        (int)Am_Clip_And_Map((long)value_v, (long)value_1, (long)value_2,
                             (long)minpos, (long)maxpos);
  else // calc in float and then convert result to integers
    return_val =
        (int)Am_Clip_And_Map((float)value_v, (float)value_1, (float)value_2,
                             (float)minpos, (float)maxpos);
  return return_val;
}